

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void ARGBToRGB565Row_SSE2(uint8_t *src,uint8_t *dst,int width)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  do {
    uVar4 = *(uint *)src;
    uVar5 = *(uint *)((long)src + 4);
    uVar6 = *(uint *)((long)src + 8);
    uVar7 = *(uint *)((long)src + 0xc);
    auVar11._0_4_ = uVar4 >> 3;
    auVar11._4_4_ = uVar5 >> 3;
    auVar11._8_4_ = uVar6 >> 3;
    auVar11._12_4_ = uVar7 >> 3;
    auVar12._0_4_ = uVar4 >> 5;
    auVar12._4_4_ = uVar5 >> 5;
    auVar12._8_4_ = uVar6 >> 5;
    auVar12._12_4_ = uVar7 >> 5;
    auVar9._0_4_ = (int)(uVar4 << 8) >> 0x10;
    auVar9._4_4_ = (int)(uVar5 << 8) >> 0x10;
    auVar9._8_4_ = (int)(uVar6 << 8) >> 0x10;
    auVar9._12_4_ = (int)(uVar7 << 8) >> 0x10;
    auVar10[8] = 0x1f;
    auVar10._0_8_ = 0x1f0000001f;
    auVar10._9_3_ = 0;
    auVar10[0xc] = 0x1f;
    auVar10._13_3_ = 0;
    auVar2[8] = 0xe0;
    auVar2._0_8_ = 0x7e0000007e0;
    auVar2[9] = 7;
    auVar2._10_2_ = 0;
    auVar2[0xc] = 0xe0;
    auVar2[0xd] = 7;
    auVar2._14_2_ = 0;
    auVar3[9] = 0xf8;
    auVar3._0_9_ = (unkuint9)0xfffff800fffff800;
    auVar3[10] = 0xff;
    auVar3[0xb] = 0xff;
    auVar3[0xc] = 0;
    auVar3[0xd] = 0xf8;
    auVar3[0xe] = 0xff;
    auVar3[0xf] = 0xff;
    auVar10 = auVar9 & auVar3 | auVar11 & auVar10 | auVar12 & auVar2;
    auVar10 = packssdw(auVar10,auVar10);
    src = (uint8_t *)((long)src + 0x10);
    *(long *)dst = auVar10._0_8_;
    dst = dst + 8;
    iVar8 = width + -4;
    bVar1 = 3 < width;
    width = iVar8;
  } while (iVar8 != 0 && bVar1);
  return;
}

Assistant:

void ARGBToRGB565Row_SSE2(const uint8_t* src, uint8_t* dst, int width) {
  asm volatile(
      "pcmpeqb     %%xmm3,%%xmm3                 \n"
      "psrld       $0x1b,%%xmm3                  \n"
      "pcmpeqb     %%xmm4,%%xmm4                 \n"
      "psrld       $0x1a,%%xmm4                  \n"
      "pslld       $0x5,%%xmm4                   \n"
      "pcmpeqb     %%xmm5,%%xmm5                 \n"
      "pslld       $0xb,%%xmm5                   \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "movdqa      %%xmm0,%%xmm2                 \n"
      "pslld       $0x8,%%xmm0                   \n"
      "psrld       $0x3,%%xmm1                   \n"
      "psrld       $0x5,%%xmm2                   \n"
      "psrad       $0x10,%%xmm0                  \n"
      "pand        %%xmm3,%%xmm1                 \n"
      "pand        %%xmm4,%%xmm2                 \n"
      "pand        %%xmm5,%%xmm0                 \n"
      "por         %%xmm2,%%xmm1                 \n"
      "por         %%xmm1,%%xmm0                 \n"
      "packssdw    %%xmm0,%%xmm0                 \n"
      "lea         0x10(%0),%0                   \n"
      "movq        %%xmm0,(%1)                   \n"
      "lea         0x8(%1),%1                    \n"
      "sub         $0x4,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src),   // %0
        "+r"(dst),   // %1
        "+r"(width)  // %2
        ::"memory",
        "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5");
}